

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

void print_time(FILE *fp)

{
  tm *__tp;
  time_t raw_time;
  char time_string [9];
  time_t tStack_28;
  char local_20 [16];
  
  time(&tStack_28);
  __tp = localtime(&tStack_28);
  local_20[8] = 0;
  local_20[0] = '\0';
  local_20[1] = '\0';
  local_20[2] = '\0';
  local_20[3] = '\0';
  local_20[4] = '\0';
  local_20[5] = '\0';
  local_20[6] = '\0';
  local_20[7] = '\0';
  strftime(local_20,9,"%H:%M:%S",__tp);
  fprintf((FILE *)fp,"%s  ",local_20);
  return;
}

Assistant:

void print_time(FILE* fp) {
    time_t raw_time;
    time (&raw_time);
    struct tm * time_info = localtime(&raw_time);

    char time_string[9] = {0};
    strftime(time_string, 9, "%H:%M:%S", time_info);

    fprintf(fp, "%s  ", time_string);
}